

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O2

int genPiecesRecusively(piecefunc_t *gen,PieceEnv *env,Piece *current,int depth)

{
  Piece *pPVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  PieceEnv *pPVar6;
  PieceEnv *pPVar7;
  ulong uVar8;
  ulong uVar9;
  int n_local;
  PieceEnv env_local;
  
  iVar3 = 0;
  if (depth < 9) {
    n_local = 0;
    pPVar6 = env;
    pPVar7 = &env_local;
    for (lVar5 = 0xd; lVar5 != 0; lVar5 = lVar5 + -1) {
      pPVar7->list = pPVar6->list;
      pPVar6 = (PieceEnv *)&pPVar6->n;
      pPVar7 = (PieceEnv *)&pPVar7->n;
    }
    env_local.list = env->list + *env->n;
    env_local.n = &n_local;
    iVar3 = (*gen)(&env_local,current,depth);
    if (iVar3 == 0) {
LAB_0010b251:
      iVar3 = 0;
    }
    else {
      uVar4 = *env->rng * 0x5deece66d + 0xb;
      *env->rng = uVar4 & 0xffffffffffff;
      uVar8 = 0;
      if (0 < n_local) {
        uVar8 = (ulong)(uint)n_local;
      }
      for (uVar9 = 0; uVar9 != uVar8; uVar9 = uVar9 + 1) {
        env_local.list[uVar9].depth = (int8_t)(uVar4 >> 0x10);
        uVar2 = *env->n;
        if (*env->n < 1) {
          uVar2 = 0;
        }
        for (lVar5 = 0; (ulong)uVar2 * 0x38 - lVar5 != 0; lVar5 = lVar5 + 0x38) {
          pPVar1 = env->list;
          if ((((env_local.list[uVar9].bb0.x <= *(int *)((long)&(pPVar1->bb1).x + lVar5)) &&
               (*(int *)((long)&(pPVar1->bb0).x + lVar5) <= env_local.list[uVar9].bb1.x)) &&
              (env_local.list[uVar9].bb0.z <= *(int *)((long)&(pPVar1->bb1).z + lVar5))) &&
             (((*(int *)((long)&(pPVar1->bb0).z + lVar5) <= env_local.list[uVar9].bb1.z &&
               (env_local.list[uVar9].bb0.y <= *(int *)((long)&(pPVar1->bb1).y + lVar5))) &&
              (*(int *)((long)&(pPVar1->bb0).y + lVar5) <= env_local.list[uVar9].bb1.y)))) {
            if (current->depth != (&pPVar1->depth)[lVar5]) goto LAB_0010b251;
            break;
          }
        }
      }
      *env->n = *env->n + n_local;
      iVar3 = 1;
    }
  }
  return iVar3;
}

Assistant:

static
int genPiecesRecusively(piecefunc_t gen, PieceEnv *env, Piece *current, int depth)
{
    if (depth > 8)
        return 0;
    int i, j, n_local = 0;
    PieceEnv env_local = *env;
    env_local.list = env->list + *env->n;
    env_local.n = &n_local;
    if (!gen(&env_local, current, depth))
        return 0;
    int gendepth = next(env->rng, 32);
    for (i = 0; i < n_local; i++)
    {
        Piece *p = env_local.list + i;
        p->depth = gendepth;
        for (j = 0; j < *env->n; j++)
        {   // check for piece with bounding box collition
            Piece *q = env->list + j;
            if (q->bb1.x >= p->bb0.x && q->bb0.x <= p->bb1.x &&
                q->bb1.z >= p->bb0.z && q->bb0.z <= p->bb1.z &&
                q->bb1.y >= p->bb0.y && q->bb0.y <= p->bb1.y)
            {
                if (current->depth != q->depth)
                    return 0;
                break;
            }
        }
    }
    (*env->n) += n_local;
    return 1;
}